

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void canvas_iemguis(_glist *gl,t_symbol *guiobjname)

{
  t_symbol *sel;
  _glist *p_Var1;
  _glist *x;
  void *data;
  int local_44;
  int local_40;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  int connectme;
  _binbuf *b;
  t_atom at;
  t_symbol *guiobjname_local;
  _glist *gl_local;
  
  at.a_w.w_symbol = guiobjname;
  _xpix = binbuf_new();
  canvas_howputnew(gl,&ypix,&indx,&nobj,&local_40,&local_44);
  sel = gensym("editmode");
  pd_vmess((t_pd *)gl,sel,"i",1);
  glist_noselect(gl);
  b._0_4_ = 2;
  at._0_8_ = at.a_w;
  binbuf_restore(_xpix,1,(t_atom *)&b);
  canvas_objtext(gl,indx / gl->gl_zoom,nobj / gl->gl_zoom,0,1,_xpix);
  if (ypix == 0) {
    p_Var1 = glist_getcanvas(gl);
    canvas_startmotion(p_Var1);
  }
  else {
    canvas_connect(gl,(float)local_40,0.0,(float)local_44,0.0);
  }
  p_Var1 = glist_getcanvas(gl);
  x = glist_getcanvas(gl);
  data = canvas_undo_set_create(x);
  canvas_undo_add(p_Var1,UNDO_CREATE,"create",data);
  return;
}

Assistant:

void canvas_iemguis(t_glist *gl, t_symbol *guiobjname)
{
    t_atom at;
    t_binbuf *b = binbuf_new();

    int connectme, xpix, ypix, indx, nobj;
    canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);

    pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);

    glist_noselect(gl);
    SETSYMBOL(&at, guiobjname);
    binbuf_restore(b, 1, &at);

    canvas_objtext(gl, xpix/gl->gl_zoom, ypix/gl->gl_zoom, 0, 1, b);
    if(connectme)
        canvas_connect(gl, indx, 0, nobj, 0);
    else canvas_startmotion(glist_getcanvas(gl));
    canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
        (void *)canvas_undo_set_create(glist_getcanvas(gl)));
}